

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O1

void __thiscall
capnp::List<capnp::List<capnp::Text,_(capnp::Kind)1>,_(capnp::Kind)6>::Builder::set
          (Builder *this,uint index,initializer_list<capnp::Text::Reader> value)

{
  iterator pRVar1;
  iterator pRVar2;
  ulong uVar3;
  const_iterator __begin0;
  Builder l;
  PointerBuilder local_60;
  ListBuilder local_48;
  
  pRVar1 = value._M_array;
  local_60.pointer =
       (WirePointer *)((this->builder).ptr + ((ulong)(this->builder).step * (ulong)index >> 3));
  local_60.segment = (this->builder).segment;
  local_60.capTable = (this->builder).capTable;
  _::PointerBuilder::initList(&local_48,&local_60,POINTER,(ElementCount)value._M_len);
  if (value._M_len != 0) {
    pRVar2 = pRVar1 + value._M_len;
    uVar3 = 0;
    do {
      local_60.pointer = (WirePointer *)(local_48.ptr + (local_48.step * uVar3 >> 3));
      local_60.segment = local_48.segment;
      local_60.capTable = local_48.capTable;
      _::PointerBuilder::setBlob<capnp::Text>(&local_60,(Reader)(pRVar1->super_StringPtr).content);
      pRVar1 = pRVar1 + 1;
      uVar3 = (ulong)((int)uVar3 + 1);
    } while (pRVar1 != pRVar2);
  }
  return;
}

Assistant:

void set(uint index, std::initializer_list<ReaderFor<T>> value) {
      KJ_IREQUIRE(index < size());
      auto l = init(index, value.size());
      uint i = 0;
      for (auto& element: value) {
        l.set(i++, element);
      }
    }